

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::ScaleValueFromRatioT<unsigned_long_long,long_long,double>
          (ImGuiDataType data_type,float t,unsigned_long_long v_min,unsigned_long_long v_max,
          bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  float local_114;
  float local_10c;
  float local_d4;
  float local_c8;
  float local_c0;
  float local_b8;
  float local_b4;
  float local_ac;
  float local_a4;
  double local_a0;
  float local_94;
  float local_8c;
  double local_88;
  float local_7c;
  float local_74;
  double v_new_off_f;
  bool is_floating_point;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  bool flipped;
  double v_max_fudged;
  double v_min_fudged;
  unsigned_long_long result;
  float local_30;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  bool is_logarithmic_local;
  unsigned_long_long v_max_local;
  unsigned_long_long v_min_local;
  float t_local;
  ImGuiDataType data_type_local;
  
  _t_local = (double)v_min;
  if (((0.0 < t) && (v_min != v_max)) && (_t_local = (double)v_max, t < 1.0)) {
    v_min_fudged = 0.0;
    result._4_4_ = zero_deadzone_halfsize;
    local_30 = logarithmic_zero_epsilon;
    zero_deadzone_halfsize_local._3_1_ = is_logarithmic;
    _logarithmic_zero_epsilon_local = v_max;
    v_max_local = v_min;
    v_min_local._0_4_ = t;
    v_min_local._4_4_ = data_type;
    if (is_logarithmic) {
      auVar7._8_4_ = (int)(v_min >> 0x20);
      auVar7._0_8_ = v_min;
      auVar7._12_4_ = 0x45300000;
      dVar6 = ImAbs((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)v_min) - 4503599627370496.0));
      if ((double)local_30 <= dVar6) {
        auVar8._8_4_ = (int)(v_max_local >> 0x20);
        auVar8._0_8_ = v_max_local;
        auVar8._12_4_ = 0x45300000;
        local_88 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)v_max_local) - 4503599627370496.0);
      }
      else {
        local_74 = (float)v_max_local;
        if (0.0 <= local_74) {
          local_7c = local_30;
        }
        else {
          local_7c = -local_30;
        }
        local_88 = (double)local_7c;
      }
      v_max_fudged = local_88;
      auVar9._8_4_ = (int)(_logarithmic_zero_epsilon_local >> 0x20);
      auVar9._0_8_ = _logarithmic_zero_epsilon_local;
      auVar9._12_4_ = 0x45300000;
      dVar6 = ImAbs((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_logarithmic_zero_epsilon_local) -
                    4503599627370496.0));
      if ((double)local_30 <= dVar6) {
        auVar10._8_4_ = (int)(_logarithmic_zero_epsilon_local >> 0x20);
        auVar10._0_8_ = _logarithmic_zero_epsilon_local;
        auVar10._12_4_ = 0x45300000;
        local_a0 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)_logarithmic_zero_epsilon_local) -
                   4503599627370496.0);
      }
      else {
        local_8c = (float)_logarithmic_zero_epsilon_local;
        if (0.0 <= local_8c) {
          local_94 = local_30;
        }
        else {
          local_94 = -local_30;
        }
        local_a0 = (double)local_94;
      }
      _t_with_flip = local_a0;
      bVar3 = _logarithmic_zero_epsilon_local < v_max_local;
      if (bVar3) {
        ImSwap<double>(&v_max_fudged,(double *)&t_with_flip);
      }
      dVar6 = v_max_fudged;
      local_a4 = (float)_logarithmic_zero_epsilon_local;
      if (((local_a4 == 0.0) && (!NAN(local_a4))) && (local_ac = (float)v_max_local, local_ac < 0.0)
         ) {
        _t_with_flip = (double)-local_30;
      }
      dVar11 = _t_with_flip;
      if (bVar3) {
        local_b4 = 1.0 - (float)v_min_local;
      }
      else {
        local_b4 = (float)v_min_local;
      }
      local_b8 = (float)(v_max_local * _logarithmic_zero_epsilon_local);
      if (0.0 <= local_b8) {
        local_10c = (float)v_max_local;
        if ((local_10c < 0.0) ||
           (local_114 = (float)_logarithmic_zero_epsilon_local, local_114 < 0.0)) {
          dVar6 = ImPow(v_max_fudged / _t_with_flip,(double)(1.0 - local_b4));
          uVar2 = (ulong)(dVar11 * dVar6);
          v_min_fudged = (double)(uVar2 | (long)(dVar11 * dVar6 - 9.223372036854776e+18) &
                                          (long)uVar2 >> 0x3f);
        }
        else {
          dVar11 = ImPow(_t_with_flip / v_max_fudged,(double)local_b4);
          uVar2 = (ulong)(dVar6 * dVar11);
          v_min_fudged = (double)(uVar2 | (long)(dVar6 * dVar11 - 9.223372036854776e+18) &
                                          (long)uVar2 >> 0x3f);
        }
      }
      else {
        uVar1 = ImMin<unsigned_long_long>(v_max_local,_logarithmic_zero_epsilon_local);
        local_c0 = (float)uVar1;
        local_c8 = (float)_logarithmic_zero_epsilon_local;
        local_d4 = (float)v_max_local;
        fVar4 = ImAbs(local_c8 - local_d4);
        fVar4 = -local_c0 / fVar4;
        fVar5 = fVar4 + result._4_4_;
        if ((local_b4 < fVar4 - result._4_4_) || (fVar5 < local_b4)) {
          if (fVar4 <= local_b4) {
            dVar11 = (double)local_30;
            dVar6 = ImPow(_t_with_flip / dVar11,(double)((local_b4 - fVar5) / (1.0 - fVar5)));
            dVar11 = dVar11 * dVar6;
            uVar2 = (ulong)dVar11;
            v_min_fudged = (double)(uVar2 | (long)(dVar11 - 9.223372036854776e+18) &
                                            (long)uVar2 >> 0x3f);
          }
          else {
            dVar11 = (double)local_30;
            dVar6 = ImPow(-v_max_fudged / dVar11,(double)(1.0 - local_b4 / (fVar4 - result._4_4_)));
            dVar6 = -(dVar11 * dVar6);
            uVar2 = (ulong)dVar6;
            v_min_fudged = (double)(uVar2 | (long)(dVar6 - 9.223372036854776e+18) &
                                            (long)uVar2 >> 0x3f);
          }
        }
        else {
          v_min_fudged = 0.0;
        }
      }
    }
    else if (data_type == 8 || data_type == 9) {
      v_min_fudged = (double)ImLerp<unsigned_long_long>(v_min,v_max,t);
    }
    else if (t < 1.0) {
      fVar4 = -0.5;
      if (v_min <= v_max) {
        fVar4 = 0.5;
      }
      v_min_fudged = (double)(v_min + (long)((float)(long)(v_max - v_min) * t + fVar4));
    }
    _t_local = v_min_fudged;
  }
  return (unsigned_long_long)_t_local;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    // We special-case the extents because otherwise our logarithmic fudging can lead to "mathematically correct"
    // but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value. Also generally simpler.
    if (t <= 0.0f || v_min == v_max)
        return v_min;
    if (t >= 1.0f)
        return v_max;

    TYPE result = (TYPE)0;
    if (is_logarithmic)
    {
        // Fudge min/max to avoid getting silly results close to zero
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        const bool flipped = v_max < v_min; // Check if range is "backwards"
        if (flipped)
            ImSwap(v_min_fudged, v_max_fudged);

        // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

        if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
        {
            float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
            else if (t_with_flip < zero_point_center)
                result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
            else
                result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
        else
            result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
    }
    else
    {
        // Linear slider
        const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else if (t < 1.0)
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
            result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
        }
    }

    return result;
}